

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_ManFree(Dtt_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *__ptr_01;
  long lVar1;
  long lVar2;
  
  Vec_IntFreeP(&p->vVisited);
  if (p->pTable != (uint *)0x0) {
    free(p->pTable);
    p->pTable = (uint *)0x0;
  }
  if (p->pNodes != (int *)0x0) {
    free(p->pNodes);
    p->pNodes = (int *)0x0;
  }
  if (p->pTimes != (int *)0x0) {
    free(p->pTimes);
    p->pTimes = (int *)0x0;
  }
  if (p->pVisited != (char *)0x0) {
    free(p->pVisited);
    p->pVisited = (char *)0x0;
  }
  Vec_IntFreeP(&p->vFanins);
  Vec_IntFreeP(&p->vTruths);
  Vec_IntFreeP(&p->vConfigs);
  Vec_IntFreeP(&p->vClasses);
  Vec_IntFreeP(&p->vTruthNpns);
  __ptr = p->vFunNodes;
  if (__ptr != (Vec_Wec_t *)0x0) {
    __ptr_01 = __ptr->pArray;
    lVar2 = 8;
    for (lVar1 = 0; lVar1 < __ptr->nCap; lVar1 = lVar1 + 1) {
      __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar2);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        __ptr_01 = __ptr->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x10;
    }
    free(__ptr_01);
    free(__ptr);
    p->vFunNodes = (Vec_Wec_t *)0x0;
  }
  Vec_IntFreeP(&p->vTemp);
  Vec_IntFreeP(&p->vTemp2);
  Vec_IntFreeP(&p->vUsedBins);
  if (p->pPerms != (int *)0x0) {
    free(p->pPerms);
    p->pPerms = (int *)0x0;
  }
  if (p->pComps != (int *)0x0) {
    free(p->pComps);
    p->pComps = (int *)0x0;
  }
  if (p->pPres != (word *)0x0) {
    free(p->pPres);
    p->pPres = (word *)0x0;
  }
  free(p->pBins);
  free(p);
  return;
}

Assistant:

void Dtt_ManFree( Dtt_Man_t * p )
{
    Vec_IntFreeP( &p->vVisited );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pVisited );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vConfigs );
    Vec_IntFreeP( &p->vClasses );
    Vec_IntFreeP( &p->vTruthNpns );
    Vec_WecFreeP( &p->vFunNodes );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vTemp2 );
    Vec_IntFreeP( &p->vUsedBins );
    ABC_FREE( p->pPerms );
    ABC_FREE( p->pComps );
    ABC_FREE( p->pPres );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}